

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

uint16_t bitset_container_minimum(bitset_container_t *container)

{
  ulong uVar1;
  long lVar2;
  ulong *puVar3;
  long lVar4;
  
  puVar3 = container->words;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == -0x10000) {
      return 0xffff;
    }
    uVar1 = *puVar3;
    if (uVar1 != 0) break;
    lVar4 = lVar4 + -0x40;
    puVar3 = puVar3 + 1;
  }
  lVar2 = 0;
  if (uVar1 != 0) {
    for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  return (short)lVar2 - (short)lVar4;
}

Assistant:

uint16_t bitset_container_minimum(const bitset_container_t *container) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_trailing_zeroes(w);
      return r + i * 64;
    }
  }
  return UINT16_MAX;
}